

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(int argc,char **argv)

{
  cmd_ln_t *pcVar1;
  char *mdeffile;
  char *mdeffile_00;
  long lVar2;
  char *pcStack_b0;
  int32 ignore_wpos;
  char *countfn;
  char *untiedmdeffn;
  char *alltphnmdeffn;
  char *cimdeffn;
  char **CIlist;
  char *fillerdictfn;
  char *dictfn;
  char *lsnfile;
  char *incdmdef;
  char *triphnlist;
  char *incimdef;
  char *phnlist;
  uint local_48;
  int32 ncd;
  int32 tph_list_given;
  int32 threshold;
  int32 cdheapsize;
  int32 cilistsize;
  dicthashelement_t **dicthash;
  phnhashelement_t **CIhash;
  hashelement_t **CDhash;
  heapelement_t **CDheap;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  CDhash = (hashelement_t **)0x0;
  CIhash = (phnhashelement_t **)0x0;
  dicthash = (dicthashelement_t **)0x0;
  _cdheapsize = (dicthashelement_t **)0x0;
  threshold = 0;
  tph_list_given = 0;
  cimdeffn = (char *)0x0;
  CDheap = (heapelement_t **)argv;
  argv_local._0_4_ = argc;
  parse_cmd_ln(argc,argv);
  pcVar1 = cmd_ln_get();
  mdeffile = cmd_ln_str_r(pcVar1,"-ocimdef");
  pcVar1 = cmd_ln_get();
  mdeffile_00 = cmd_ln_str_r(pcVar1,"-oalltphnmdef");
  pcVar1 = cmd_ln_get();
  countfn = cmd_ln_str_r(pcVar1,"-ountiedmdef");
  pcVar1 = cmd_ln_get();
  pcStack_b0 = cmd_ln_str_r(pcVar1,"-ocountfn");
  pcVar1 = cmd_ln_get();
  lVar2 = cmd_ln_int_r(pcVar1,"-ignorewpos");
  if (mdeffile != (char *)0x0) {
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/main.c"
            ,0x5c,"Will write CI mdef file %s\n");
  }
  if (mdeffile_00 != (char *)0x0) {
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/main.c"
            ,0x5e,"Will write alltriphone mdef file %s\n");
  }
  if (countfn != (char *)0x0) {
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/main.c"
            ,0x5f,"Will write untied mdef file %s\n");
  }
  if (pcStack_b0 != (char *)0x0) {
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/main.c"
            ,0x60,"Will write triphone counts file %s\n");
  }
  if ((((mdeffile == (char *)0x0) && (mdeffile_00 == (char *)0x0)) && (countfn == (char *)0x0)) &&
     (pcStack_b0 == (char *)0x0)) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/main.c"
            ,99,"No output mdef files or count files specified!\n");
    exit(1);
  }
  pcVar1 = cmd_ln_get();
  fillerdictfn = cmd_ln_str_r(pcVar1,"-dictfn");
  pcVar1 = cmd_ln_get();
  CIlist = (char **)cmd_ln_str_r(pcVar1,"-fdictfn");
  pcVar1 = cmd_ln_get();
  dictfn = cmd_ln_str_r(pcVar1,"-lsnfn");
  if (((countfn != (char *)0x0) || (pcStack_b0 != (char *)0x0)) &&
     ((dictfn == (char *)0x0 || (fillerdictfn == (char *)0x0)))) {
    err_msg(ERR_WARN,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/main.c"
            ,0x69,"Either dictionary or transcript file not given!\n");
    if (countfn != (char *)0x0) {
      err_msg(ERR_WARN,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/main.c"
              ,0x6a,"Untied mdef will not be made\n");
    }
    if (pcStack_b0 != (char *)0x0) {
      err_msg(ERR_WARN,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/main.c"
              ,0x6b,"Phone counts will not be generated\n");
    }
    pcStack_b0 = (char *)0x0;
    countfn = (char *)0x0;
  }
  pcVar1 = cmd_ln_get();
  incimdef = cmd_ln_str_r(pcVar1,"-phnlstfn");
  pcVar1 = cmd_ln_get();
  incdmdef = cmd_ln_str_r(pcVar1,"-triphnlstfn");
  pcVar1 = cmd_ln_get();
  triphnlist = cmd_ln_str_r(pcVar1,"-inCImdef");
  pcVar1 = cmd_ln_get();
  lsnfile = cmd_ln_str_r(pcVar1,"-inCDmdef");
  if (((lsnfile == (char *)0x0) && (triphnlist == (char *)0x0)) &&
     ((incimdef == (char *)0x0 && (incdmdef == (char *)0x0)))) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/main.c"
            ,0x74,"No input mdefs or phone list given\n");
    exit(1);
  }
  if (incdmdef != (char *)0x0) {
    if (incimdef != (char *)0x0) {
      err_msg(ERR_WARN,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/main.c"
              ,0x77,"Both -triphnlist %s and -phnlist given.\n",incdmdef);
    }
    err_msg(ERR_WARN,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/main.c"
            ,0x78,"Ignoring -phnlist %s\n");
    incimdef = incdmdef;
  }
  local_48 = (uint)(incdmdef != (char *)0x0 || lsnfile != (char *)0x0);
  if (lsnfile == (char *)0x0) {
    if (incimdef != (char *)0x0) {
      make_ci_list_cd_hash_frm_phnlist
                (incimdef,(char ***)&cimdeffn,&threshold,(hashelement_t ***)&CIhash,
                 (int32 *)((long)&phnlist + 4));
    }
    if (triphnlist != (char *)0x0) {
      if (cimdeffn != (char *)0x0) {
        ckd_free_2d(cimdeffn);
      }
      make_ci_list_frm_mdef(triphnlist,(char ***)&cimdeffn,&threshold);
    }
  }
  else {
    if ((triphnlist != (char *)0x0) || (incimdef != (char *)0x0)) {
      err_msg(ERR_WARN,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/main.c"
              ,0x7f,"Using only input CD mdef %s!\n",lsnfile);
      err_msg(ERR_WARN,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/main.c"
              ,0x80,"Using only triphones from input CD mdef %s!\n",lsnfile);
      if (triphnlist != (char *)0x0) {
        err_msg(ERR_WARN,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/main.c"
                ,0x81,"CImdef %s will be ignored\n",triphnlist);
      }
      if (incimdef != (char *)0x0) {
        err_msg(ERR_WARN,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/main.c"
                ,0x82,"phonelist %s will be ignored\n",incimdef);
      }
      incimdef = (char *)0x0;
      triphnlist = (char *)0x0;
    }
    make_ci_list_cd_hash_frm_mdef
              (lsnfile,(char ***)&cimdeffn,&threshold,(hashelement_t ***)&CIhash,
               (int32 *)((long)&phnlist + 4));
  }
  if (mdeffile != (char *)0x0) {
    make_mdef_from_list(mdeffile,(char **)cimdeffn,threshold,(heapelement_t **)0x0,0,(char *)*CDheap
                       );
  }
  if ((local_48 == 0) && (mdeffile == (char *)0x0)) {
    read_dict(fillerdictfn,(char *)CIlist,(dicthashelement_t ***)&cdheapsize);
    if (CIhash != (phnhashelement_t **)0x0) {
      freehash((hashelement_t **)CIhash);
    }
    make_dict_triphone_list(_cdheapsize,(hashelement_t ***)&CIhash,(int)lVar2);
  }
  if (mdeffile_00 != (char *)0x0) {
    ncd = -1;
    make_CD_heap((hashelement_t **)CIhash,-1,(heapelement_t ***)&CDhash,&tph_list_given);
    make_mdef_from_list(mdeffile_00,(char **)cimdeffn,threshold,(heapelement_t **)CDhash,
                        tph_list_given,(char *)*CDheap);
  }
  if ((pcStack_b0 != (char *)0x0) || (countfn != (char *)0x0)) {
    count_triphones(dictfn,_cdheapsize,(hashelement_t **)CIhash,(phnhashelement_t ***)&dicthash,
                    (int)lVar2);
  }
  if (pcStack_b0 != (char *)0x0) {
    print_counts(pcStack_b0,(phnhashelement_t **)dicthash,(hashelement_t **)CIhash);
  }
  if (countfn != (char *)0x0) {
    ncd = find_threshold((hashelement_t **)CIhash);
    make_CD_heap((hashelement_t **)CIhash,ncd,(heapelement_t ***)&CDhash,&tph_list_given);
    make_mdef_from_list(countfn,(char **)cimdeffn,threshold,(heapelement_t **)CDhash,tph_list_given,
                        (char *)*CDheap);
  }
  return 0;
}

Assistant:

int main (int argc, char **argv)
{
    heapelement_t **CDheap=NULL;
    hashelement_t **CDhash=NULL;
    phnhashelement_t **CIhash=NULL;
    dicthashelement_t **dicthash=NULL;
    int32  cilistsize=0, cdheapsize=0, threshold, tph_list_given, ncd;
    const char   *phnlist, *incimdef, *triphnlist, *incdmdef;
    const char   *lsnfile, *dictfn, *fillerdictfn;
    char **CIlist=NULL;
    const char   *cimdeffn, *alltphnmdeffn, *untiedmdeffn, *countfn;
    int32 ignore_wpos;

    parse_cmd_ln(argc,argv);

    /* Test all flags before beginning */
    cimdeffn = cmd_ln_str("-ocimdef");
    alltphnmdeffn = cmd_ln_str("-oalltphnmdef");
    untiedmdeffn = cmd_ln_str("-ountiedmdef");
    countfn = cmd_ln_str("-ocountfn");
    ignore_wpos = cmd_ln_int32("-ignorewpos");

    if (cimdeffn) E_INFO("Will write CI mdef file %s\n",cimdeffn);
    if (alltphnmdeffn) 
	E_INFO("Will write alltriphone mdef file %s\n",alltphnmdeffn);
    if (untiedmdeffn) E_INFO("Will write untied mdef file %s\n",untiedmdeffn);
    if (countfn) E_INFO("Will write triphone counts file %s\n",countfn);

    if (!cimdeffn && !alltphnmdeffn && !untiedmdeffn && !countfn)
	E_FATAL("No output mdef files or count files specified!\n");

    dictfn = cmd_ln_str("-dictfn");
    fillerdictfn = cmd_ln_str("-fdictfn");
    lsnfile = cmd_ln_str("-lsnfn");
    if ((untiedmdeffn || countfn) && (!lsnfile || !dictfn)) {
	E_WARN("Either dictionary or transcript file not given!\n"); 
  	if (untiedmdeffn) E_WARN("Untied mdef will not be made\n");
  	if (countfn) E_WARN("Phone counts will not be generated\n");
	untiedmdeffn = countfn = NULL;
    }

    phnlist = cmd_ln_str("-phnlstfn");
    triphnlist = cmd_ln_str("-triphnlstfn");
    incimdef = cmd_ln_str("-inCImdef");
    incdmdef = cmd_ln_str("-inCDmdef");
    if (!incdmdef && !incimdef && !phnlist && !triphnlist)
	E_FATAL("No input mdefs or phone list given\n");
    if (triphnlist) {
	if (phnlist) 
	    E_WARN("Both -triphnlist %s and -phnlist given.\n",triphnlist);
	    E_WARN("Ignoring -phnlist %s\n",phnlist);
        phnlist = triphnlist;
    }
    tph_list_given =  (triphnlist || incdmdef) ? 1 : 0;

    if (incdmdef) {
	if (incimdef || phnlist){
	    E_WARN("Using only input CD mdef %s!\n",incdmdef);
	    E_WARN("Using only triphones from input CD mdef %s!\n",incdmdef);
	    if (incimdef) E_WARN("CImdef %s will be ignored\n",incimdef);
	    if (phnlist) E_WARN("phonelist %s will be ignored\n",phnlist);
	    incimdef = phnlist = NULL; 
	}
	make_ci_list_cd_hash_frm_mdef(incdmdef,&CIlist,&cilistsize,
							   &CDhash,&ncd);
    }
    else{
        if (phnlist)
	    make_ci_list_cd_hash_frm_phnlist(phnlist,&CIlist,
						&cilistsize,&CDhash,&ncd);
	if (incimdef) {
	    if (CIlist) ckd_free_2d((void**)CIlist);
	    make_ci_list_frm_mdef(incimdef,&CIlist,&cilistsize);
        }
    }
    if (cimdeffn) 
	make_mdef_from_list(cimdeffn,CIlist,cilistsize,NULL,0,argv[0]);

    if (!tph_list_given && !cimdeffn) {
	read_dict(dictfn, fillerdictfn, &dicthash);
	if (CDhash) freehash(CDhash);
	make_dict_triphone_list (dicthash, &CDhash, ignore_wpos);
    }

    if (alltphnmdeffn){
	threshold = -1;
	make_CD_heap(CDhash,threshold,&CDheap,&cdheapsize);
    	make_mdef_from_list(alltphnmdeffn,CIlist,cilistsize,
					CDheap,cdheapsize,argv[0]);
    }
    if (countfn || untiedmdeffn) 
        count_triphones(lsnfile, dicthash, CDhash, &CIhash, ignore_wpos);
    if (countfn){
	print_counts(countfn,CIhash,CDhash);
    }
    if (untiedmdeffn){
        threshold = find_threshold(CDhash);
        make_CD_heap(CDhash,threshold,&CDheap,&cdheapsize);
        make_mdef_from_list(untiedmdeffn,CIlist,cilistsize,
			    CDheap,cdheapsize,argv[0]);
    }
    return 0;
}